

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHLineTextObject.cpp
# Opt level: O3

QSizeF __thiscall
KDReports::HLineTextObject::intrinsicSize
          (HLineTextObject *this,QTextDocument *doc,int posInDocument,QTextFormat *format)

{
  double dVar1;
  double dVar2;
  double dVar3;
  QSizeF QVar4;
  QTextFrameFormat f;
  QTextFrame local_30 [16];
  double local_20;
  double local_18;
  
  QTextDocument::rootFrame();
  QTextFrame::frameFormat(local_30);
  dVar1 = (double)QTextDocument::pageSize();
  dVar2 = (double)QTextFrameFormat::leftMargin();
  local_18 = (double)QTextFrameFormat::rightMargin();
  local_20 = (double)QTextFormat::doubleProperty((int)format);
  dVar3 = (double)QTextFormat::doubleProperty((int)format);
  dVar2 = dVar2 + local_18;
  dVar3 = dVar3 + dVar3 + local_20;
  QTextFormat::~QTextFormat((QTextFormat *)local_30);
  QVar4.ht = dVar3;
  QVar4.wd = dVar1 - dVar2;
  return QVar4;
}

Assistant:

QSizeF HLineTextObject::intrinsicSize(QTextDocument *doc, int posInDocument, const QTextFormat &format)
{
    Q_UNUSED(posInDocument);

    QTextFrameFormat f = doc->rootFrame()->frameFormat();
    const qreal width = doc->pageSize().width() - (f.leftMargin() + f.rightMargin());

    const double thickness = format.doubleProperty(Thickness);
    const double margin = format.doubleProperty(Margin);
    // qDebug() << "intrinsicSize: thickness=" << thickness << "margin=" << margin;

    return QSizeF(width, thickness + 2 * margin);
}